

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

int __thiscall Popup::init(Popup *this,EVP_PKEY_CTX *ctx)

{
  PopupTransition PVar1;
  ulong uVar2;
  
  uVar2._0_4_ = this->height;
  uVar2._4_4_ = this->width;
  uVar2 = uVar2 << 0x20 | uVar2 >> 0x20;
  this->x = (int)uVar2;
  this->y = (int)(uVar2 >> 0x20);
  PVar1 = this->transition;
  if (PVar1 - TRANSITION_SLIDEINBOTTOM < 2) {
    this->x = 0;
    return PVar1;
  }
  if (PVar1 == TRANSITION_FADE) {
    this->alpha = 0.0;
    this->x = 0;
    this->y = 0;
  }
  return PVar1;
}

Assistant:

void Popup::init()
{
	x = width;
	y = height;
	switch(transition)
	{
		case TRANSITION_SLIDEINBOTTOM:
		case TRANSITION_PUSHUP:
			x = 0;
			break;
		case TRANSITION_FADE:
			alpha = 0;
			x = 0;
			y = 0;
			break;
		default:
			break;
	}
}